

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

uint32 __thiscall Js::DiagScopeVariablesWalker::GetChildrenCount(DiagScopeVariablesWalker *this)

{
  RecyclableArrayWalker *this_00;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int offset;
  int iVar5;
  RegSlot RVar6;
  int iVar7;
  undefined4 *puVar8;
  undefined4 extraout_var;
  FunctionBody *this_01;
  ScopeObjectChain *pSVar9;
  undefined4 extraout_var_00;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar10;
  Type *pTVar11;
  IDiagObjectModelWalkerBase *pIVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RecyclableObjectWalker *this_02;
  undefined4 extraout_var_03;
  undefined **ppuVar13;
  _func_int **pp_Var14;
  DiagStackFrame *pDVar15;
  undefined **local_58;
  
  if (this->scopeIsInitialized == false) {
    pDVar15 = (this->super_VariableWalkerBase).pFrame;
    if (pDVar15 == (DiagStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x3ac,"(pFrame)","pFrame");
      if (!bVar3) {
LAB_008afe4d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      pDVar15 = (this->super_VariableWalkerBase).pFrame;
    }
    iVar4 = (*pDVar15->_vptr_DiagStackFrame[2])();
    this_01 = JavascriptFunction::GetFunctionBody
                        ((JavascriptFunction *)CONCAT44(extraout_var,iVar4));
    pSVar9 = FunctionBody::GetScopeObjectChain(this_01);
    if (pSVar9 != (ScopeObjectChain *)0x0) {
      offset = LocalsWalker::GetAdjustedByteCodeOffset((this->super_VariableWalkerBase).pFrame);
      iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
      alloc = GetArenaFromContext((ScriptContext *)CONCAT44(extraout_var_00,iVar5));
      pLVar10 = (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
      (pLVar10->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .alloc = alloc;
      (pLVar10->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014e43c8;
      (pLVar10->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .buffer = (Type)0x0;
      (pLVar10->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .count = 0;
      pLVar10->length = 0;
      pLVar10->increment = 4;
      this->pDiagScopeObjects = pLVar10;
      pSVar9 = FunctionBody::GetScopeObjectChain(this_01);
      iVar4 = (((pSVar9->pScopeChain).ptr)->
              super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count;
      if (-1 < iVar4 + -1) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        local_58 = &PTR_Get_014e2e50;
        do {
          iVar4 = iVar4 + -1;
          pTVar11 = JsUtil::
                    List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((pSVar9->pScopeChain).ptr,iVar4);
          this_00 = (RecyclableArrayWalker *)pTVar11->ptr;
          bVar3 = DebuggerScope::IsOffsetInScope((DebuggerScope *)this_00,offset);
          if (((!bVar3) || (bVar3 = DebuggerScope::IsParamScope((DebuggerScope *)this_00), bVar3))
             || ((this_00->indexedItemCount == 0xffffffff &&
                 ((*(Type *)&(this_00->super_RecyclableObjectWalker).instance !=
                   DiagBlockScopeDirect ||
                  (bVar3 = DebuggerScope::HasProperties((DebuggerScope *)this_00), !bVar3))))))
          goto LAB_008afe2e;
          switch(*(Type *)&(this_00->super_RecyclableObjectWalker).instance) {
          case DiagWithScope:
            if (this->enumWithScopeAlso == true) {
              this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
              pDVar15 = (this->super_VariableWalkerBase).pFrame;
              RVar6 = DebuggerScope::GetLocation((DebuggerScope *)this_00);
              iVar7 = (*pDVar15->_vptr_DiagStackFrame[5])(pDVar15,(ulong)RVar6,1);
              RecyclableObjectWalker::RecyclableObjectWalker
                        (this_02,(ScriptContext *)CONCAT44(extraout_var_00,iVar5),
                         (Var)CONCAT44(extraout_var_02,iVar7));
              pLVar10 = this->pDiagScopeObjects;
              JsUtil::
              List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::EnsureArray(pLVar10,0);
              iVar7 = (pLVar10->
                      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count;
              (pLVar10->
              super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).buffer[iVar7] = (IDiagObjectModelWalkerBase *)this_02;
              (pLVar10->
              super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).count = iVar7 + 1;
              pp_Var14 = (this_02->super_IDiagObjectModelWalkerBase).
                         _vptr_IDiagObjectModelWalkerBase;
              goto LAB_008afe28;
            }
            break;
          case DiagCatchScopeDirect:
          case DiagCatchScopeInObject:
            pIVar12 = (IDiagObjectModelWalkerBase *)new<Memory::ArenaAllocator>(0x18,alloc,0x364470)
            ;
            pDVar15 = (this->super_VariableWalkerBase).pFrame;
            pIVar12->_vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_014e2ef0;
            pIVar12[1]._vptr_IDiagObjectModelWalkerBase = (_func_int **)pDVar15;
            pIVar12[2]._vptr_IDiagObjectModelWalkerBase = (_func_int **)this_00;
            pLVar10 = this->pDiagScopeObjects;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pLVar10,0);
            iVar7 = (pLVar10->
                    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (pLVar10->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar7] = pIVar12;
            (pLVar10->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar7 + 1;
            iVar7 = *(int *)(pIVar12[2]._vptr_IDiagObjectModelWalkerBase[1] + 0x10);
            goto LAB_008afe2b;
          case DiagCatchScopeInSlot:
          case DiagBlockScopeInSlot:
            this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
            pSVar1 = (ScriptContext *)(this->super_VariableWalkerBase).pFrame;
            DebuggerScope::GetLocation((DebuggerScope *)this_00);
            iVar7 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x12])(pSVar1);
            this_02->scriptContext = pSVar1;
            this_02->instance = (Var)CONCAT44(extraout_var_01,iVar7);
            this_02->originalInstance = (Var)0x0;
            *(undefined4 *)&this_02->pMembersList = 1;
            *(undefined2 *)((long)&this_02->pMembersList + 4) = 0;
            ppuVar13 = &PTR_Get_014e2e00;
            goto LAB_008afdf3;
          case DiagBlockScopeDirect:
            this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
            this_02->scriptContext = (ScriptContext *)(this->super_VariableWalkerBase).pFrame;
            this_02->instance = (Var)0x0;
            this_02->originalInstance = (Var)0x0;
            *(undefined4 *)&this_02->pMembersList = 1;
            *(undefined2 *)((long)&this_02->pMembersList + 4) = 0;
            (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
                 (_func_int **)&PTR_Get_014e2db0;
            this_02->innerArrayObjectWalker = this_00;
            pLVar10 = this->pDiagScopeObjects;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pLVar10,0);
            iVar7 = (pLVar10->
                    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (pLVar10->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar7] = (IDiagObjectModelWalkerBase *)this_02;
            (pLVar10->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar7 + 1;
            pp_Var14 = (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase;
            goto LAB_008afe28;
          case DiagBlockScopeInObject:
            this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
            pSVar1 = (ScriptContext *)(this->super_VariableWalkerBase).pFrame;
            DebuggerScope::GetLocation((DebuggerScope *)this_00);
            iVar7 = (*(pSVar1->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x12])(pSVar1);
            this_02->scriptContext = pSVar1;
            this_02->instance = (Var)CONCAT44(extraout_var_03,iVar7);
            this_02->originalInstance = (Var)0x0;
            *(undefined4 *)&this_02->pMembersList = 1;
            *(undefined2 *)((long)&this_02->pMembersList + 4) = 0;
            ppuVar13 = local_58;
LAB_008afdf3:
            (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
                 (_func_int **)ppuVar13;
            pLVar10 = this->pDiagScopeObjects;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pLVar10,0);
            iVar7 = (pLVar10->
                    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (pLVar10->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar7] = &this_02->super_IDiagObjectModelWalkerBase;
            (pLVar10->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar7 + 1;
            pp_Var14 = (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase;
LAB_008afe28:
            iVar7 = (*pp_Var14[1])(this_02);
LAB_008afe2b:
            this->diagScopeVarCount = this->diagScopeVarCount + iVar7;
            break;
          default:
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x3f0,"(false)","false");
            if (!bVar3) goto LAB_008afe4d;
            *puVar8 = 0;
          }
LAB_008afe2e:
        } while (0 < iVar4);
      }
    }
    this->scopeIsInitialized = true;
  }
  return this->diagScopeVarCount;
}

Assistant:

uint32 DiagScopeVariablesWalker::GetChildrenCount()
    {
        if (scopeIsInitialized)
        {
            return diagScopeVarCount;
        }
        Assert(pFrame);
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();

        if (pFBody->GetScopeObjectChain())
        {
            int bytecodeOffset = GetAdjustedByteCodeOffset();
            ScriptContext * scriptContext = pFrame->GetScriptContext();
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);
            pDiagScopeObjects = JsUtil::List<IDiagObjectModelWalkerBase *, ArenaAllocator>::New(arena);

            // Look for catch/with/block scopes which encompass current offset (skip block scopes as
            // they are only used for lookup within the RegSlotVariablesWalker).

            // Go the reverse way so that we find the innermost scope first;
            Js::ScopeObjectChain * pScopeObjectChain = pFBody->GetScopeObjectChain();
            for (int i = pScopeObjectChain->pScopeChain->Count() - 1 ; i >= 0; i--)
            {
                Js::DebuggerScope *debuggerScope = pScopeObjectChain->pScopeChain->Item(i);
                bool isScopeInRange = debuggerScope->IsOffsetInScope(bytecodeOffset);
                if (isScopeInRange
                    && !debuggerScope->IsParamScope()
                    && (debuggerScope->IsOwnScope() || (debuggerScope->scopeType == DiagBlockScopeDirect && debuggerScope->HasProperties())))
                {
                    switch (debuggerScope->scopeType)
                    {
                    case DiagWithScope:
                        {
                            if (enumWithScopeAlso)
                            {
                                RecyclableObjectWalker* recylableObjectWalker = Anew(arena, RecyclableObjectWalker, scriptContext,
                                    (Var)pFrame->GetRegValue(debuggerScope->GetLocation(), true));
                                pDiagScopeObjects->Add(recylableObjectWalker);
                                diagScopeVarCount += recylableObjectWalker->GetChildrenCount();
                            }
                        }
                        break;
                    case DiagCatchScopeDirect:
                    case DiagCatchScopeInObject:
                        {
                            CatchScopeWalker* catchScopeWalker = Anew(arena, CatchScopeWalker, pFrame, debuggerScope);
                            pDiagScopeObjects->Add(catchScopeWalker);
                            diagScopeVarCount += catchScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagCatchScopeInSlot:
                    case DiagBlockScopeInSlot:
                        {
                            SlotArrayVariablesWalker* blockScopeWalker = Anew(arena, SlotArrayVariablesWalker, pFrame,
                                (Var)pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(blockScopeWalker);
                            diagScopeVarCount += blockScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeDirect:
                        {
                            RegSlotVariablesWalker *pObjWalker = Anew(arena, RegSlotVariablesWalker, pFrame, debuggerScope, UIGroupType_InnerScope);
                            pDiagScopeObjects->Add(pObjWalker);
                            diagScopeVarCount += pObjWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeInObject:
                        {
                            ObjectVariablesWalker* objectVariablesWalker = Anew(arena, ObjectVariablesWalker, pFrame, pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(objectVariablesWalker);
                            diagScopeVarCount += objectVariablesWalker->GetChildrenCount();
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }
        }
        scopeIsInitialized = true;
        return diagScopeVarCount;
    }